

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O0

void BrotliEncoderCleanupState(BrotliEncoderStateInternal *s)

{
  MemoryManager *m_00;
  long in_RDI;
  MemoryManager *m;
  BrotliEncoderParams *in_stack_ffffffffffffffc8;
  
  m_00 = (MemoryManager *)(in_RDI + 0x578);
  duckdb_brotli::BrotliFree(m_00,in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x658) = 0;
  duckdb_brotli::BrotliFree(m_00,in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x5c8) = 0;
  duckdb_brotli::BrotliFree(m_00,in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x5b0) = 0;
  if (*(long *)(in_RDI + 0x660) != 0) {
    duckdb_brotli::BrotliFree(m_00,in_stack_ffffffffffffffc8);
    *(long *)(in_RDI + 0x660) = 0;
  }
  if (*(long *)(in_RDI + 0x668) != 0) {
    duckdb_brotli::BrotliFree(m_00,in_stack_ffffffffffffffc8);
    *(undefined8 *)(in_RDI + 0x668) = 0;
  }
  if (*(long *)(in_RDI + 0x670) != 0) {
    duckdb_brotli::BrotliFree(m_00,in_stack_ffffffffffffffc8);
    *(undefined8 *)(in_RDI + 0x670) = 0;
  }
  if (*(long *)(in_RDI + 0x678) != 0) {
    duckdb_brotli::BrotliFree(m_00,in_stack_ffffffffffffffc8);
    *(undefined8 *)(in_RDI + 0x678) = 0;
  }
  duckdb_brotli::BrotliFree(m_00,in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x1ad0) = 0;
  duckdb_brotli::BrotliFree(m_00,in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x1ae0) = 0;
  duckdb_brotli::BrotliFree(m_00,in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x1ae8) = 0;
  duckdb_brotli::BrotliFree(m_00,in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x1af0) = 0;
  duckdb_brotli::BrotliFree(m_00,in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x1af8) = 0;
  BrotliEncoderCleanupParams(m_00,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void BrotliEncoderCleanupState(BrotliEncoderState* s) {
  MemoryManager* m = &s->memory_manager_;

  BROTLI_ENCODER_ON_FINISH(s);

  if (BROTLI_IS_OOM(m)) {
    BrotliWipeOutMemoryManager(m);
    return;
  }

  BROTLI_FREE(m, s->storage_);
  BROTLI_FREE(m, s->commands_);
  RingBufferFree(m, &s->ringbuffer_);
  DestroyHasher(m, &s->hasher_);
  BROTLI_FREE(m, s->large_table_);
  BROTLI_FREE(m, s->one_pass_arena_);
  BROTLI_FREE(m, s->two_pass_arena_);
  BROTLI_FREE(m, s->command_buf_);
  BROTLI_FREE(m, s->literal_buf_);
  BrotliEncoderCleanupParams(m, &s->params);
}